

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_Interval __thiscall
ON_PlaneEquation::ValueRange
          (ON_PlaneEquation *this,size_t point_index_count,size_t point_index_stride,
          uint *point_index_list,ON_3dPointListRef *point_list)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  float *pfVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  uint uVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  ON_Interval OVar20;
  ON_Interval OVar21;
  
  dVar1 = this->x;
  dVar15 = ON_Interval::EmptyInterval.m_t[0];
  dVar14 = ON_Interval::EmptyInterval.m_t[1];
  if ((((ABS(dVar1) < 1.23432101234321e+308) &&
       (dVar2 = this->y, ABS(dVar2) < 1.23432101234321e+308)) &&
      (dVar3 = this->z, ABS(dVar3) < 1.23432101234321e+308)) &&
     (((dVar4 = this->d, ABS(dVar4) < 1.23432101234321e+308 &&
       (uVar10 = point_list->m_point_count, uVar10 != 0)) &&
      (uVar9 = (uint)point_index_count,
      uVar9 != 0 && 0xffffffff00000001 < point_index_count - 0xffffffff)))) {
    if (point_index_list == (uint *)0x0) {
      if (uVar9 - 1 < uVar10) {
        pdVar5 = point_list->m_dP;
        pfVar6 = point_list->m_fP;
        uVar10 = 0;
        sVar11 = 0;
        do {
          if (pdVar5 == (double *)0x0) {
            dVar16 = (double)(float)*(undefined8 *)(pfVar6 + uVar10);
            dVar18 = (double)(float)((ulong)*(undefined8 *)(pfVar6 + uVar10) >> 0x20);
            dVar15 = (double)pfVar6[(ulong)uVar10 + 2];
          }
          else {
            dVar16 = pdVar5[uVar10];
            dVar18 = (pdVar5 + uVar10)[1];
            dVar15 = pdVar5[(ulong)uVar10 + 2];
          }
          dVar15 = dVar15 * dVar3 + dVar18 * dVar2 + dVar1 * dVar16 + dVar4;
          if (ABS(dVar15) < 1.23432101234321e+308) {
            if ((int)sVar11 + 1U < uVar9) {
              uVar8 = (uVar9 - 1) - sVar11;
              dVar16 = dVar15;
              do {
                uVar10 = uVar10 + point_list->m_point_stride;
                if (pdVar5 == (double *)0x0) {
                  dVar18 = (double)(float)*(undefined8 *)(pfVar6 + uVar10);
                  dVar17 = (double)(float)((ulong)*(undefined8 *)(pfVar6 + uVar10) >> 0x20);
                  dVar14 = (double)pfVar6[(ulong)uVar10 + 2];
                }
                else {
                  dVar18 = pdVar5[uVar10];
                  dVar17 = (pdVar5 + uVar10)[1];
                  dVar14 = pdVar5[(ulong)uVar10 + 2];
                }
                dVar14 = dVar14 * dVar3 + dVar17 * dVar2 + dVar1 * dVar18 + dVar4;
                dVar18 = dVar15;
                if (((1.23432101234321e+308 <= ABS(dVar14)) || (dVar18 = dVar14, dVar14 < dVar15))
                   || (dVar18 = dVar15, dVar14 <= dVar16)) {
                  dVar15 = dVar18;
                  dVar14 = dVar16;
                }
                uVar9 = (int)uVar8 - 1;
                uVar8 = (ulong)uVar9;
                dVar16 = dVar14;
              } while (uVar9 != 0);
              break;
            }
            goto LAB_0057ce46;
          }
          sVar11 = sVar11 + 1;
          uVar10 = uVar10 + point_list->m_point_stride;
          dVar15 = ON_Interval::EmptyInterval.m_t[0];
        } while (point_index_count != sVar11);
      }
    }
    else {
      iVar7 = (int)point_index_stride;
      if ((iVar7 != 0 && point_index_stride - 1 >> 1 < 0x7fffffff) &&
         (uVar9 = iVar7 * uVar9, uVar9 != 0)) {
        pdVar5 = point_list->m_dP;
        pfVar6 = point_list->m_fP;
        uVar12 = 1;
        do {
          if (point_index_list[uVar12 - 1] < uVar10) {
            uVar8 = (ulong)(point_index_list[uVar12 - 1] * point_list->m_point_stride);
            if (pdVar5 == (double *)0x0) {
              dVar16 = (double)(float)*(undefined8 *)(pfVar6 + uVar8);
              dVar18 = (double)(float)((ulong)*(undefined8 *)(pfVar6 + uVar8) >> 0x20);
              dVar15 = (double)pfVar6[uVar8 + 2];
            }
            else {
              dVar16 = pdVar5[uVar8];
              dVar18 = (pdVar5 + uVar8)[1];
              dVar15 = pdVar5[uVar8 + 2];
            }
            dVar15 = dVar15 * dVar3 + dVar18 * dVar2 + dVar1 * dVar16 + dVar4;
            if (ABS(dVar15) < 1.23432101234321e+308) {
              dVar16 = dVar15;
              if (uVar9 <= uVar12) {
LAB_0057ce46:
                OVar21.m_t[1] = dVar15;
                OVar21.m_t[0] = dVar15;
                return (ON_Interval)OVar21.m_t;
              }
              goto LAB_0057cdb2;
            }
          }
          iVar13 = uVar12 + iVar7;
          uVar12 = uVar12 + iVar7;
          dVar15 = ON_Interval::EmptyInterval.m_t[0];
        } while (iVar13 - 1U < uVar9);
      }
    }
  }
  goto LAB_0057ce45;
LAB_0057cdb2:
  do {
    dVar18 = dVar15;
    if (point_index_list[uVar12] < uVar10) {
      uVar8 = (ulong)(point_index_list[uVar12] * point_list->m_point_stride);
      if (pdVar5 == (double *)0x0) {
        dVar17 = (double)(float)*(undefined8 *)(pfVar6 + uVar8);
        dVar19 = (double)(float)((ulong)*(undefined8 *)(pfVar6 + uVar8) >> 0x20);
        dVar14 = (double)pfVar6[uVar8 + 2];
      }
      else {
        dVar17 = pdVar5[uVar8];
        dVar19 = (pdVar5 + uVar8)[1];
        dVar14 = pdVar5[uVar8 + 2];
      }
      dVar14 = dVar14 * dVar3 + dVar19 * dVar2 + dVar1 * dVar17 + dVar4;
      if (((1.23432101234321e+308 <= ABS(dVar14)) || (dVar18 = dVar14, dVar14 < dVar15)) ||
         (dVar18 = dVar15, dVar14 <= dVar16)) goto LAB_0057ce2f;
    }
    else {
LAB_0057ce2f:
      dVar15 = dVar18;
      dVar14 = dVar16;
    }
    uVar12 = uVar12 + iVar7;
    dVar16 = dVar14;
  } while (uVar12 < uVar9);
LAB_0057ce45:
  OVar20.m_t[1] = dVar14;
  OVar20.m_t[0] = dVar15;
  return (ON_Interval)OVar20.m_t;
}

Assistant:

ON_Interval ON_PlaneEquation::ValueRange(
  size_t point_index_count,
  size_t point_index_stride,
  const unsigned int* point_index_list,
  const class ON_3dPointListRef& point_list
  ) const
{
  ON_Interval value_interval(ON_Interval::EmptyInterval);

  for(;;)
  {
    if ( false == IsValid() )
      break; // invalid plane equation;

    double h;
    const unsigned int vertex_count = point_list.PointCount();
    if ( 0 == vertex_count )
      break;
    const unsigned int point_count = (point_index_count > 0 && point_index_count < (size_t)ON_UNSET_UINT_INDEX)
                                   ? ((unsigned int)point_index_count)
                                   : 0;
    if ( 0 == point_count )
      break;

    if ( 0 != point_index_list )
    {
      const unsigned int point_stride = (point_index_stride > 0 && point_index_stride < (size_t)ON_UNSET_UINT_INDEX)
                                      ? ((unsigned int)point_index_stride)
                                      : 0;
      if ( 0 == point_stride )
        break;
      for ( unsigned int i = 0; i < point_count*point_stride; i += point_stride )
      {
        unsigned int j = point_index_list[i];
        if ( j >= vertex_count )
          continue;
        h = ValueAt(point_list[j]);
        if ( ON_IsValid(h) )
        {
          value_interval.Set(h,h);
          for (i++; i < point_count*point_stride; i+= point_stride )
          {
            unsigned int j_local = point_index_list[i];
            if ( j_local >= vertex_count )
              continue;
            h = ValueAt(point_list[j_local]);
            if ( ON_IsValid(h) )
            {
              if ( h < value_interval.m_t[0] )
                value_interval.m_t[0] = h;
              else if ( h > value_interval.m_t[1] )
                value_interval.m_t[1] = h;
            }
          }
          break;
        }
      }
    }
    else if ( point_count <= vertex_count )
    {
      for ( unsigned int i = 0; i < point_count; i++ )
      {        
        h = ValueAt(point_list[i]);
        if ( ON_IsValid(h) )
        {
          value_interval.Set(h,h);
          for (i++; i < point_count; i++ )
          {
            h = ValueAt(point_list[i]);
            if ( ON_IsValid(h) )
            {
              if ( h < value_interval.m_t[0] )
                value_interval.m_t[0] = h;
              else if ( h > value_interval.m_t[1] )
                value_interval.m_t[1] = h;
            }
          }
          break;
        }
      }
    }

    break;
  }
  return value_interval;
}